

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_asub_s_h_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  pfVar2 = (env->active_fpu).fpr + wt;
  sVar11 = *(short *)pfVar1 - *(short *)pfVar2;
  sVar12 = *(short *)((long)pfVar1 + 2) - *(short *)((long)pfVar2 + 2);
  sVar13 = *(short *)((long)pfVar1 + 4) - *(short *)((long)pfVar2 + 4);
  sVar14 = *(short *)((long)pfVar1 + 6) - *(short *)((long)pfVar2 + 6);
  sVar15 = *(short *)((long)pfVar1 + 8) - *(short *)((long)pfVar2 + 8);
  sVar16 = *(short *)((long)pfVar1 + 10) - *(short *)((long)pfVar2 + 10);
  sVar17 = *(short *)((long)pfVar1 + 0xc) - *(short *)((long)pfVar2 + 0xc);
  sVar18 = *(short *)((long)pfVar1 + 0xe) - *(short *)((long)pfVar2 + 0xe);
  sVar3 = -sVar11;
  sVar4 = -sVar12;
  sVar5 = -sVar13;
  sVar6 = -sVar14;
  sVar7 = -sVar15;
  sVar8 = -sVar16;
  sVar9 = -sVar17;
  sVar10 = -sVar18;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar1 = (ushort)(sVar3 < sVar11) * sVar11 | (ushort)(sVar3 >= sVar11) * sVar3;
  *(ushort *)((long)pfVar1 + 2) =
       (ushort)(sVar4 < sVar12) * sVar12 | (ushort)(sVar4 >= sVar12) * sVar4;
  *(ushort *)((long)pfVar1 + 4) =
       (ushort)(sVar5 < sVar13) * sVar13 | (ushort)(sVar5 >= sVar13) * sVar5;
  *(ushort *)((long)pfVar1 + 6) =
       (ushort)(sVar6 < sVar14) * sVar14 | (ushort)(sVar6 >= sVar14) * sVar6;
  *(ushort *)((long)pfVar1 + 8) =
       (ushort)(sVar7 < sVar15) * sVar15 | (ushort)(sVar7 >= sVar15) * sVar7;
  *(ushort *)((long)pfVar1 + 10) =
       (ushort)(sVar8 < sVar16) * sVar16 | (ushort)(sVar8 >= sVar16) * sVar8;
  *(ushort *)((long)pfVar1 + 0xc) =
       (ushort)(sVar9 < sVar17) * sVar17 | (ushort)(sVar9 >= sVar17) * sVar9;
  *(ushort *)((long)pfVar1 + 0xe) =
       (ushort)(sVar10 < sVar18) * sVar18 | (ushort)(sVar10 >= sVar18) * sVar10;
  return;
}

Assistant:

void helper_msa_asub_s_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_asub_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_asub_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_asub_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_asub_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_asub_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_asub_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_asub_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_asub_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}